

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

int __thiscall crnd::prefix_coding::decoder_tables::init(decoder_tables *this,EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  unsigned_short *puVar7;
  uint *puVar8;
  byte bVar9;
  uint in_ECX;
  long in_RDX;
  uint32 j_1;
  uint32 i_4;
  uint32 i_3;
  uint32 t;
  uint32 j;
  uint32 sym_index;
  uint32 code;
  uint32 val_ptr;
  uint32 max_code;
  uint32 min_code;
  uint32 fillnum;
  uint32 fillsize;
  uint32 codesize;
  uint32 table_size;
  uint32 sorted_pos;
  uint32 c_1;
  uint32 i_2;
  uint32 n;
  uint32 i_1;
  uint32 min_code_size;
  uint32 max_code_size;
  uint32 total_used_syms;
  uint32 cur_code;
  uint32 sorted_positions [17];
  uint32 c;
  uint32 i;
  uint32 num_codes [17];
  uint32 min_codes [16];
  uint32 in_stack_fffffffffffffe9c;
  uint32 local_160;
  uint local_15c;
  uint local_154;
  uint local_14c;
  uint local_134;
  uint local_124;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint auStack_108 [18];
  uint local_c0;
  uint local_bc;
  int local_b8 [20];
  uint auStack_68 [17];
  uint32 local_24;
  long local_20;
  uint32 local_14;
  decoder_tables *local_10;
  undefined1 local_1;
  
  local_14 = (uint32)ctx;
  if ((local_14 == 0) || (0xb < in_ECX)) {
    local_1 = 0;
  }
  else {
    this->m_num_syms = local_14;
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_10 = this;
    utils::zero_object<unsigned_int[17]>((uint (*) [17])0x11d07e);
    for (local_bc = 0; local_bc < local_14; local_bc = local_bc + 1) {
      local_c0 = (uint)*(byte *)(local_20 + (ulong)local_bc);
      if (local_c0 != 0) {
        local_b8[local_c0] = local_b8[local_c0] + 1;
      }
    }
    local_10c = 0;
    local_110 = 0;
    local_114 = 0;
    local_118 = 0xffffffff;
    for (local_11c = 1; local_11c < 0x11; local_11c = local_11c + 1) {
      iVar2 = local_b8[local_11c];
      if (iVar2 == 0) {
        this->m_max_codes[local_11c - 1] = 0;
      }
      else {
        local_118 = math::minimum<unsigned_int>(local_118,local_11c);
        local_114 = math::maximum<unsigned_int>(local_114,local_11c);
        auStack_68[local_11c - 1] = local_10c;
        this->m_max_codes[local_11c - 1] = (local_10c + iVar2) - 1;
        this->m_max_codes[local_11c - 1] =
             (this->m_max_codes[local_11c - 1] << (0x10U - (char)local_11c & 0x1f) |
             (1 << (0x10U - (char)local_11c & 0x1f)) - 1U) + 1;
        this->m_val_ptrs[local_11c - 1] = local_110;
        auStack_108[local_11c] = local_110;
        local_10c = iVar2 + local_10c;
        local_110 = iVar2 + local_110;
      }
      local_10c = local_10c << 1;
    }
    this->m_total_used_syms = local_110;
    if (this->m_cur_sorted_symbol_order_size < local_110) {
      this->m_cur_sorted_symbol_order_size = local_110;
      bVar4 = math::is_power_of_2(local_110);
      uVar6 = local_14;
      if (!bVar4) {
        uVar5 = math::next_pow2(local_110);
        uVar5 = math::minimum<unsigned_int>(uVar6,uVar5);
        this->m_cur_sorted_symbol_order_size = uVar5;
      }
      if (this->m_sorted_symbol_order != (uint16 *)0x0) {
        crnd_delete_array<unsigned_short>((unsigned_short *)this);
      }
      puVar7 = crnd_new_array<unsigned_short>(in_stack_fffffffffffffe9c);
      this->m_sorted_symbol_order = puVar7;
      if (this->m_sorted_symbol_order == (uint16 *)0x0) {
        local_1 = 0;
        goto LAB_0011d6bf;
      }
    }
    this->m_min_code_size = (uint8)local_118;
    this->m_max_code_size = (uint8)local_114;
    for (local_124 = 0; local_124 < local_14; local_124 = local_124 + 1) {
      uVar5 = (uint)*(byte *)(local_20 + (ulong)local_124);
      if (uVar5 != 0) {
        uVar3 = auStack_108[uVar5];
        auStack_108[uVar5] = uVar3 + 1;
        this->m_sorted_symbol_order[uVar3] = (uint16)local_124;
      }
    }
    if (local_24 <= this->m_min_code_size) {
      local_24 = 0;
    }
    this->m_table_bits = local_24;
    if (local_24 != 0) {
      uVar5 = 1 << ((byte)local_24 & 0x1f);
      if (this->m_cur_lookup_size < uVar5) {
        this->m_cur_lookup_size = uVar5;
        if (this->m_lookup != (uint32 *)0x0) {
          crnd_delete_array<unsigned_int>(&this->m_num_syms);
        }
        puVar8 = crnd_new_array<unsigned_int>(in_stack_fffffffffffffe9c);
        this->m_lookup = puVar8;
        if (this->m_lookup == (uint32 *)0x0) {
          local_1 = 0;
          goto LAB_0011d6bf;
        }
      }
      memset(this->m_lookup,0xff,(1L << ((byte)local_24 & 0x3f)) << 2);
      for (local_134 = 1; local_134 <= local_24; local_134 = local_134 + 1) {
        if (local_b8[local_134] != 0) {
          bVar9 = (char)local_24 - (char)local_134;
          uVar5 = auStack_68[local_134 - 1];
          uVar6 = get_unshifted_max_code(this,local_134);
          iVar2 = this->m_val_ptrs[local_134 - 1];
          for (local_14c = uVar5; local_14c <= uVar6; local_14c = local_14c + 1) {
            uVar1 = this->m_sorted_symbol_order[(iVar2 + local_14c) - uVar5];
            for (local_154 = 0; local_154 < (uint)(1 << (bVar9 & 0x1f)); local_154 = local_154 + 1)
            {
              this->m_lookup[local_154 + (local_14c << (bVar9 & 0x1f))] =
                   (uint)uVar1 | local_134 << 0x10;
            }
          }
        }
      }
    }
    for (local_15c = 0; local_15c < 0x10; local_15c = local_15c + 1) {
      this->m_val_ptrs[local_15c] = this->m_val_ptrs[local_15c] - auStack_68[local_15c];
    }
    this->m_table_max_code = 0;
    this->m_decode_start_code_size = (uint)this->m_min_code_size;
    if (local_24 != 0) {
      for (local_160 = local_24; local_160 != 0; local_160 = local_160 - 1) {
        if (local_b8[local_160] != 0) {
          this->m_table_max_code = this->m_max_codes[local_160 - 1];
          break;
        }
      }
      if (local_160 != 0) {
        this->m_decode_start_code_size = local_24 + 1;
        do {
          local_24 = local_24 + 1;
          if (local_114 < local_24) goto LAB_0011d696;
        } while (local_b8[local_24] == 0);
        this->m_decode_start_code_size = local_24;
      }
    }
LAB_0011d696:
    this->m_max_codes[0x10] = 0xffffffff;
    this->m_val_ptrs[0x10] = 0xfffff;
    this->m_table_shift = 0x20 - this->m_table_bits;
    local_1 = 1;
  }
LAB_0011d6bf:
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool decoder_tables::init(uint32 num_syms, const uint8* pCodesizes, uint32 table_bits) {
  uint32 min_codes[cMaxExpectedCodeSize];
  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  m_num_syms = num_syms;

  uint32 num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint32 i = 0; i < num_syms; i++) {
    uint32 c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint32 sorted_positions[cMaxExpectedCodeSize + 1];

  uint32 cur_code = 0;

  uint32 total_used_syms = 0;
  uint32 max_code_size = 0;
  uint32 min_code_size = cUINT32_MAX;
  for (uint32 i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint32 n = num_codes[i];

    if (!n)
      m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = cur_code;

      m_max_codes[i - 1] = cur_code + n - 1;
      m_max_codes[i - 1] = 1 + ((m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      cur_code += n;
      total_used_syms += n;
    }

    cur_code <<= 1;
  }

  m_total_used_syms = total_used_syms;

  if (total_used_syms > m_cur_sorted_symbol_order_size) {
    m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      m_cur_sorted_symbol_order_size = math::minimum<uint32>(num_syms, math::next_pow2(total_used_syms));

    if (m_sorted_symbol_order)
      crnd_delete_array(m_sorted_symbol_order);

    m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
    if (!m_sorted_symbol_order)
      return false;
  }

  m_min_code_size = static_cast<uint8>(min_code_size);
  m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint32 i = 0; i < num_syms; i++) {
    uint32 c = pCodesizes[i];
    if (c) {
      CRND_ASSERT(num_codes[c]);

      uint32 sorted_pos = sorted_positions[c]++;

      CRND_ASSERT(sorted_pos < total_used_syms);

      m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= m_min_code_size)
    table_bits = 0;
  m_table_bits = table_bits;

  if (table_bits) {
    uint32 table_size = 1 << table_bits;
    if (table_size > m_cur_lookup_size) {
      m_cur_lookup_size = table_size;

      if (m_lookup)
        crnd_delete_array(m_lookup);

      m_lookup = crnd_new_array<uint32>(table_size);
      if (!m_lookup)
        return false;
    }

    memset(m_lookup, 0xFF, (uint)sizeof(m_lookup[0]) * (1UL << table_bits));

    for (uint32 codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint32 fillsize = table_bits - codesize;
      const uint32 fillnum = 1 << fillsize;

      const uint32 min_code = min_codes[codesize - 1];
      const uint32 max_code = get_unshifted_max_code(codesize);
      const uint32 val_ptr = m_val_ptrs[codesize - 1];

      for (uint32 code = min_code; code <= max_code; code++) {
        const uint32 sym_index = m_sorted_symbol_order[val_ptr + code - min_code];
        CRND_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint32 j = 0; j < fillnum; j++) {
          const uint32 t = j + (code << fillsize);

          CRND_ASSERT(t < (1U << table_bits));

          CRND_ASSERT(m_lookup[t] == cUINT32_MAX);

          m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint32 i = 0; i < cMaxExpectedCodeSize; i++)
    m_val_ptrs[i] -= min_codes[i];

  m_table_max_code = 0;
  m_decode_start_code_size = m_min_code_size;

  if (table_bits) {
    uint32 i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        m_table_max_code = m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      m_decode_start_code_size = table_bits + 1;
      for (uint32 j = table_bits + 1; j <= max_code_size; j++) {
        if (num_codes[j]) {
          m_decode_start_code_size = j;
          break;
        }
      }
    }
  }

  // sentinels
  m_max_codes[cMaxExpectedCodeSize] = cUINT32_MAX;
  m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  m_table_shift = 32 - m_table_bits;
  return true;
}